

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

_Bool override_component(ecs_world_t *world,ecs_entity_t component,ecs_type_t type,ecs_data_t *data,
                        ecs_column_t *column,int32_t row,int32_t count)

{
  long lVar1;
  void *pvVar2;
  bool bVar3;
  byte bVar4;
  ecs_table_t *peVar5;
  _Bool _Var6;
  short offset;
  int32_t iVar7;
  void *pvVar8;
  void *__src;
  ecs_entity_t component_00;
  ecs_c_info_t *peVar9;
  void *pvVar10;
  size_t sVar11;
  ecs_copy_t p_Var12;
  int iVar13;
  long lVar14;
  size_t __n;
  ecs_entity_t local_88;
  long local_80;
  void *local_78;
  ecs_entity_t local_70;
  ecs_column_t *local_68;
  ecs_entity_t local_60;
  ecs_copy_t local_58;
  ecs_entity_info_t local_50;
  
  pvVar8 = _ecs_vector_first(type,8,0x10);
  iVar7 = ecs_vector_count(type);
  local_80 = (long)row;
  lVar14 = (long)iVar7;
  do {
    local_88 = *(ulong *)((long)pvVar8 + lVar14 * 8 + -8);
    iVar13 = 2;
    bVar4 = (byte)(local_88 >> 0x38);
    if (bVar4 < 0xfd) goto LAB_001127ee;
    if (bVar4 == 0xfe) {
      local_88 = local_88 & 0xffffffffffffff;
      _ecs_assert(component != 0,0xc,(char *)0x0,"component != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x269);
      if (component == 0) {
        __assert_fail("component != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x269,
                      "_Bool override_from_base(ecs_world_t *, ecs_entity_t, ecs_entity_t, ecs_data_t *, ecs_column_t *, int32_t, int32_t)"
                     );
      }
      _Var6 = ecs_get_info(world,local_88,&local_50);
      peVar5 = local_50.table;
      if (local_50.table == (ecs_table_t *)0x0 || !_Var6) goto LAB_001127ec;
      __src = get_component(&local_50,component);
      if (__src == (void *)0x0) {
        _Var6 = override_component(world,component,peVar5->type,data,column,row,count);
        iVar13 = 1;
        if (!_Var6) goto LAB_001127ec;
      }
      else {
        iVar13 = (int)column->size;
        offset = column->alignment;
        if (offset < 0x11) {
          offset = 0x10;
        }
        local_78 = pvVar8;
        local_68 = column;
        pvVar8 = _ecs_vector_first(column->data,iVar13,offset);
        component_00 = ecs_get_typeid(world,component);
        peVar9 = ecs_get_c_info(world,component_00);
        if (peVar9 == (ecs_c_info_t *)0x0) {
          p_Var12 = (ecs_copy_t)0x0;
        }
        else {
          p_Var12 = (peVar9->lifecycle).copy;
        }
        __n = (size_t)iVar13;
        pvVar8 = (void *)((long)pvVar8 + (long)(iVar13 * row));
        local_70 = component;
        if (p_Var12 == (ecs_copy_t)0x0) {
          iVar13 = count;
          if (0 < count) {
            do {
              memcpy(pvVar8,__src,__n);
              pvVar8 = (void *)((long)pvVar8 + __n);
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
        }
        else {
          local_58 = p_Var12;
          pvVar10 = _ecs_vector_first(data->entities,8,0x10);
          local_60 = component_00;
          if (0 < count) {
            pvVar2 = (peVar9->lifecycle).ctx;
            lVar1 = local_80 * 8;
            iVar7 = count;
            do {
              sVar11 = ecs_to_size_t(__n);
              (*local_58)(world,local_60,(ecs_entity_t *)((long)pvVar10 + lVar1),&local_88,pvVar8,
                          __src,sVar11,1,pvVar2);
              pvVar8 = (void *)((long)pvVar8 + __n);
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
        }
        iVar13 = 1;
        pvVar8 = local_78;
        column = local_68;
        component = local_70;
      }
    }
    else {
LAB_001127ec:
      iVar13 = 0;
    }
LAB_001127ee:
    if (iVar13 != 0) {
      if (iVar13 == 2) {
        return false;
      }
      return true;
    }
    bVar3 = lVar14 < 2;
    lVar14 = lVar14 + -1;
    if (bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

static
bool override_component(
    ecs_world_t * world,
    ecs_entity_t component,
    ecs_type_t type,
    ecs_data_t * data,
    ecs_column_t * column,
    int32_t row,
    int32_t count)
{
    ecs_entity_t *type_array = ecs_vector_first(type, ecs_entity_t);
    int32_t i, type_count = ecs_vector_count(type);

    /* Walk prefabs */
    i = type_count - 1;
    do {
        ecs_entity_t e = type_array[i];

        if (e < ECS_TYPE_ROLE_START) {
            break;
        }

        if (ECS_HAS_ROLE(e, INSTANCEOF)) {
            if (override_from_base(world, e & ECS_COMPONENT_MASK, component, 
                data, column, row, count))
            {
                return true;
            }
        }
    } while (--i >= 0);

    return false;
}